

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_vliet.c
# Opt level: O3

void swap_gauss(float *c,float *b,int w,int h,double s)

{
  float fVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double sum;
  double M [9];
  undefined1 local_188 [48];
  undefined1 local_158 [16];
  double local_148;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  double local_88;
  undefined1 local_80 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  if (3.556 <= s) {
    dVar23 = s * 0.9804 + -0.9772023999999999;
  }
  else {
    dVar23 = (s * 0.0561 + 0.5784) * s + -0.2568;
  }
  dVar30 = dVar23 * dVar23;
  dStack_90 = 1.0 / ((dVar23 * 2.21566 + 3.2037296485000004 + dVar30) * (dVar23 + 1.1668));
  dVar3 = -dVar30 * (dVar23 * 3.0 + 3.38246) * dStack_90;
  dVar4 = dVar23 * dVar30 * dStack_90;
  uVar29 = (undefined4)((ulong)dVar4 >> 0x20);
  local_a8._8_4_ = SUB84(dVar3,0);
  local_a8._0_8_ = dVar4;
  local_a8._12_4_ = (int)((ulong)dVar3 >> 0x20);
  dVar30 = (dVar30 * 3.0 + dVar23 * 6.76492 + 5.788961736500001) * dVar23 * dStack_90;
  dStack_90 = dStack_90 * 3.7381117538698008;
  local_80._8_4_ = SUB84(dVar4,0);
  local_80._0_8_ = dVar3;
  local_80._12_4_ = uVar29;
  dVar23 = dStack_90 * dStack_90;
  uVar26 = (undefined4)((ulong)dVar23 >> 0x20);
  uVar10 = (ulong)(uint)w;
  local_188._8_4_ = SUB84(dVar4,0);
  local_188._0_8_ = dVar3;
  local_188._12_4_ = uVar29;
  local_68._8_4_ = SUB84(dStack_90,0);
  local_68._0_8_ = dStack_90;
  local_68._12_4_ = (int)((ulong)dStack_90 >> 0x20);
  local_98 = dVar30;
  local_88 = dVar30;
  if (0 < h) {
    local_48._8_4_ = SUB84(dVar23,0);
    local_48._0_8_ = dVar23;
    local_48._12_4_ = uVar26;
    dVar25 = 1.0 / dStack_90;
    dVar27 = 1.0 / (1.0 - (dVar3 + dVar30 + dVar4));
    local_58._8_4_ = SUB84(dVar23,0);
    local_58._0_8_ = dVar30;
    local_58._12_4_ = uVar26;
    iVar16 = 0;
    pfVar20 = b;
    do {
      local_148 = (double)*c * dVar25;
      fVar1 = c[w + -1];
      if (w < 1) {
        local_158._8_4_ = SUB84(local_148,0);
        local_158._0_8_ = local_148;
        local_158._12_4_ = (int)((ulong)local_148 >> 0x20);
      }
      else {
        lVar7 = 0;
        lVar12 = 0;
        dVar32 = local_148;
        dVar28 = local_148;
        dVar24 = local_148;
        do {
          local_148 = dVar24;
          dVar24 = dVar28;
          dVar28 = dVar32 * dVar4 + local_148 * dVar3 + dVar24 * dVar30 + (double)c[lVar12];
          pfVar20[lVar12] = (float)dVar28;
          lVar12 = lVar12 + 1;
          lVar7 = lVar7 + -4;
          dVar32 = local_148;
        } while (w != (int)lVar12);
        local_158._8_4_ = SUB84(dVar24,0);
        local_158._0_8_ = dVar28;
        local_158._12_4_ = (int)((ulong)dVar24 >> 0x20);
        c = (float *)((long)c - lVar7);
        pfVar20 = (float *)((long)pfVar20 - lVar7);
      }
      TriggsM((double *)local_a8,&local_f8);
      dVar32 = (double)fVar1 * dVar27;
      dVar28 = dVar32 * dVar27;
      local_148 = local_148 - dVar32;
      dVar31 = (double)local_158._0_8_ - dVar32;
      dVar32 = (double)local_158._8_8_ - dVar32;
      dVar24 = (dStack_f0 * dVar32 + local_e8 * local_148 + local_f8 * dVar31 + dVar28) * dVar23;
      pfVar20[-1] = (float)dVar24;
      if (1 < w) {
        iVar6 = w + -1;
        dVar5 = (dVar28 + dVar31 * local_c8 + local_148 * local_b8 + dVar32 * dStack_c0) *
                (double)local_48._0_8_;
        dVar28 = (dVar28 + dVar31 * local_e0 + local_148 * dStack_d0 + dVar32 * local_d8) *
                 (double)local_48._8_8_;
        do {
          dVar32 = dVar24;
          dVar24 = dVar5 * local_188._8_8_ + (double)pfVar20[-2] * (double)local_58._8_8_ +
                   dVar28 * dVar3 + dVar32 * (double)local_58._0_8_;
          pfVar20[-2] = (float)dVar24;
          pfVar20 = pfVar20 + -1;
          iVar6 = iVar6 + -1;
          dVar5 = dVar28;
          dVar28 = dVar32;
        } while (iVar6 != 0);
      }
      pfVar20 = pfVar20 + (long)w + -1;
      iVar16 = iVar16 + 1;
    } while (iVar16 != h);
  }
  lVar21 = (long)w << 3;
  lVar7 = g_malloc(lVar21);
  lVar12 = g_malloc(lVar21);
  lVar8 = g_malloc(lVar21);
  lVar9 = g_malloc(lVar21);
  lVar21 = g_malloc(lVar21);
  if (w < 1) {
    pfVar20 = b + (h + -2) * w;
  }
  else {
    lVar13 = (long)(w * (h + -2)) * -4;
    uVar14 = 0;
    do {
      dVar25 = (double)b[uVar14] * (1.0 / (double)local_68._0_8_);
      *(double *)(lVar8 + uVar14 * 8) = dVar25;
      *(double *)(lVar9 + uVar14 * 8) = dVar25;
      *(double *)(lVar21 + uVar14 * 8) = dVar25;
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + -4;
    } while (uVar10 != uVar14);
    pfVar20 = (float *)((long)b - lVar13);
    lVar13 = 0;
    do {
      fVar1 = *pfVar20;
      pfVar20 = pfVar20 + 1;
      *(double *)(lVar7 + lVar13) = (double)fVar1 * (1.0 / (1.0 - (dVar30 + dVar3 + dVar4)));
      lVar13 = lVar13 + 8;
    } while (uVar10 * 8 - lVar13 != 0);
  }
  lVar13 = lVar9;
  lVar19 = lVar21;
  lVar22 = lVar8;
  if (0 < h) {
    pfVar20 = pfVar20 + -(long)(h * w);
    iVar16 = 0;
    lVar17 = lVar21;
    lVar11 = lVar9;
    lVar15 = lVar12;
    do {
      lVar13 = lVar22;
      lVar22 = lVar15;
      lVar19 = lVar11;
      lVar15 = lVar17;
      if (0 < w) {
        lVar17 = 0;
        do {
          dVar4 = *(double *)(lVar15 + lVar17 * 2) * local_188._8_8_ +
                  *(double *)(lVar19 + lVar17 * 2) * dVar3 +
                  *(double *)(lVar13 + lVar17 * 2) * dVar30 +
                  (double)*(float *)((long)pfVar20 + lVar17);
          *(float *)((long)b + lVar17) = (float)dVar4;
          *(double *)(lVar22 + lVar17 * 2) = dVar4;
          lVar17 = lVar17 + 4;
        } while (uVar10 << 2 != lVar17);
        pfVar20 = (float *)((long)pfVar20 + lVar17);
        b = (float *)((long)b + lVar17);
      }
      iVar16 = iVar16 + 1;
      lVar17 = lVar19;
      lVar11 = lVar13;
    } while (iVar16 != h);
    local_188._0_16_ = local_80;
    dVar30 = local_88;
  }
  TriggsM((double *)local_a8,&local_f8);
  uVar10 = (ulong)(w - 1);
  if (0 < w) {
    lVar17 = lVar19 + uVar10 * 8;
    lVar11 = lVar13 + uVar10 * 8;
    lVar15 = lVar22 + uVar10 * 8;
    lVar18 = 0;
    do {
      dVar3 = *(double *)(lVar7 + uVar10 * 8 + lVar18 * 2);
      dVar4 = dVar3 * (1.0 / (1.0 - ((double)local_188._8_8_ + dVar30 + (double)local_188._0_8_)));
      dVar27 = *(double *)(lVar15 + lVar18 * 2) - dVar3;
      dVar25 = *(double *)(lVar11 + lVar18 * 2) - dVar3;
      dVar3 = *(double *)(lVar17 + lVar18 * 2) - dVar3;
      dVar28 = (local_e8 * dVar3 + local_f8 * dVar27 + dVar4 + dStack_f0 * dVar25) * dVar23;
      *(float *)((long)b + lVar18 + -4) = (float)dVar28;
      *(double *)(lVar15 + lVar18 * 2) = dVar28;
      *(double *)(lVar11 + lVar18 * 2) =
           (dStack_d0 * dVar3 + local_d8 * dVar25 + local_e0 * dVar27 + dVar4) * dVar23;
      *(double *)(lVar17 + lVar18 * 2) =
           (local_b8 * dVar3 + dVar27 * local_c8 + dVar4 + dStack_c0 * dVar25) * dVar23;
      lVar18 = lVar18 + -4;
    } while (uVar10 * 4 + 4 + lVar18 != 0);
    b = (float *)((long)b + lVar18);
  }
  if (1 < h) {
    lVar11 = uVar10 * 8;
    lVar17 = lVar7;
    iVar16 = h + -2;
    do {
      lVar18 = lVar17;
      lVar15 = lVar13;
      pfVar20 = b;
      if (0 < w) {
        lVar13 = 0;
        do {
          pfVar20 = pfVar20 + -1;
          dVar3 = *(double *)(lVar19 + lVar11 + lVar13 * 8) * (double)local_188._8_8_ +
                  *(double *)(lVar22 + lVar11 + lVar13 * 8) * dVar30 +
                  *(double *)(lVar15 + lVar11 + lVar13 * 8) * (double)local_188._0_8_ +
                  dVar23 * (double)b[lVar13 + -1];
          b[lVar13 + -1] = (float)dVar3;
          *(double *)(lVar18 + lVar11 + lVar13 * 8) = dVar3;
          lVar17 = uVar10 + 1 + lVar13;
          lVar13 = lVar13 + -1;
        } while (lVar17 != 1 && -1 < lVar17 + -1);
      }
      b = pfVar20;
      bVar2 = 0 < iVar16;
      lVar13 = lVar22;
      lVar17 = lVar19;
      lVar19 = lVar15;
      lVar22 = lVar18;
      iVar16 = iVar16 + -1;
    } while (bVar2);
  }
  g_free(lVar12);
  g_free(lVar8);
  g_free(lVar9);
  g_free(lVar21);
  g_free(lVar7);
  return;
}

Assistant:

void swap_gauss(SRCTYPE *c, DSTTYPE *b, int w, int h, double s) {
    double filter[7];

    /* calculate filter coefficients of x-direction */
    YvVfilterCoef(s, filter);
    /* filter in the x-direction */
    xline(c, b, w, h, filter);
    /* calculate filter coefficients in tanp-direction */
    /* YvVfilterCoef(s, filter); */
    yline(b, b, w, h, filter);
}